

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O0

string * __thiscall
FontInfo::getCharSetName_abi_cxx11_(string *__return_storage_ptr__,FontInfo *this,uint8_t charSet)

{
  string local_48;
  undefined1 local_12;
  byte local_11;
  string *psStack_10;
  uint8_t charSet_local;
  string *str;
  
  local_11 = (byte)this;
  local_12 = 0;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_11 == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ANSI");
  }
  else if (local_11 == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DEFAULT");
  }
  else if (local_11 == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SYMBOL");
  }
  else if (local_11 == 0x4d) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"MAC");
  }
  else if (local_11 == 0x80) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SHIFTJIS");
  }
  else if (local_11 == 0x81) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"HANGUL");
  }
  else if (local_11 == 0x82) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"JOHAB");
  }
  else if (local_11 == 0x86) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GB2312");
  }
  else if (local_11 == 0x88) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"CHINESEBIG5");
  }
  else if (local_11 == 0xa1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GREEK");
  }
  else if (local_11 == 0xa2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"TURKISH");
  }
  else if (local_11 == 0xa3) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"VIETNAMESE");
  }
  else if (local_11 == 0xb1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"HEBREW");
  }
  else if (local_11 == 0xb2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ARABIC");
  }
  else if (local_11 == 0xba) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"BALTIC");
  }
  else if (local_11 == 0xcc) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"RUSSIAN");
  }
  else if (local_11 == 0xde) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"THAI");
  }
  else if (local_11 == 0xee) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"EASTEUROPE");
  }
  else if (local_11 == 0xff) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"OEM");
  }
  else {
    std::__cxx11::to_string(&local_48,(uint)local_11);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FontInfo::getCharSetName(std::uint8_t charSet)
{
    std::string str;

    switch(charSet)
    {
        case 0: // ANSI_CHARSET
            str = "ANSI";
            break;
        case 1: // DEFAULT_CHARSET
            str = "DEFAULT";
            break;
        case 2: // SYMBOL_CHARSET
            str = "SYMBOL";
            break;
        case 128: // SHIFTJIS_CHARSET
            str = "SHIFTJIS";
            break;
        case 129: // HANGUL_CHARSET
            str = "HANGUL";
            break;
        case 134: // GB2312_CHARSET
            str = "GB2312";
            break;
        case 136: // CHINESEBIG5_CHARSET
            str = "CHINESEBIG5";
            break;
        case 255: // OEM_CHARSET
            str = "OEM";
            break;
        case 130: // JOHAB_CHARSET
            str = "JOHAB";
            break;
        case 177: // HEBREW_CHARSET
            str = "HEBREW";
            break;
        case 178: // ARABIC_CHARSET
            str = "ARABIC";
            break;
        case 161: // GREEK_CHARSET
            str = "GREEK";
            break;
        case 162: // TURKISH_CHARSET
            str = "TURKISH";
            break;
        case 163: // VIETNAMESE_CHARSET
            str = "VIETNAMESE";
            break;
        case 222: // THAI_CHARSET
            str = "THAI";
            break;
        case 238: // EASTEUROPE_CHARSET
            str = "EASTEUROPE";
            break;
        case 204: // RUSSIAN_CHARSET
            str = "RUSSIAN";
            break;
        case 77:  // MAC_CHARSET
            str = "MAC";
            break;
        case 186: // BALTIC_CHARSET
            str = "BALTIC";
            break;

        default:
            str = std::to_string(charSet);
    }

    return str;
}